

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::jumpGreaterThanOrEqualUnsigned(CodeGen *codeGen,int target)

{
  ulong local_28;
  size_t i;
  int local_18;
  int local_14;
  IntToBytes converter;
  int target_local;
  CodeGen *codeGen_local;
  
  i._7_1_ = 0xf;
  local_18 = target;
  local_14 = target;
  _converter = codeGen;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (codeGen,(value_type_conflict1 *)((long)&i + 7));
  i._6_1_ = 0x83;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_converter,(value_type_conflict1 *)((long)&i + 6));
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_converter,(value_type_conflict1 *)((long)&local_18 + local_28));
  }
  return;
}

Assistant:

void Amd64Backend::jumpGreaterThanOrEqualUnsigned(CodeGen& codeGen, int target) {
		IntToBytes converter;
		converter.intValue = target;

		codeGen.push_back(0x0F);
		codeGen.push_back(0x83);

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}